

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

void llama_grammar_accept_str(llama_grammar *grammar,string *piece)

{
  runtime_error *this;
  pointer puVar1;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> decoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  decode_utf8(&decoded,piece,grammar->partial_utf8);
  for (puVar1 = decoded.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != decoded.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1; puVar1 = puVar1 + 1) {
    llama_grammar_accept(grammar,*puVar1);
  }
  grammar->partial_utf8 = decoded.second;
  if ((grammar->stacks).
      super__Vector_base<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>,_std::allocator<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (grammar->stacks).
      super__Vector_base<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>,_std::allocator<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&decoded);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"Unexpected empty grammar stack after accepting piece: ",piece);
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void llama_grammar_accept_str(struct llama_grammar & grammar, const std::string & piece) {
    // Note terminating 0 in decoded string
    const auto   decoded     = decode_utf8(piece, grammar.partial_utf8);
    const auto & code_points = decoded.first;

    for (auto it = code_points.begin(), end = code_points.end() - 1; it != end; ++it) {
        llama_grammar_accept(&grammar, *it);
    }

    grammar.partial_utf8 = decoded.second;
    if (grammar.stacks.empty()) {
        throw std::runtime_error("Unexpected empty grammar stack after accepting piece: " + piece);
    }
}